

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

IVal * deqp::gls::BuiltinPrecisionTests::
       ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doRound
                 (IVal *__return_storage_ptr__,FloatFormat *fmt,Matrix<float,_4,_2> *value)

{
  float *pfVar1;
  undefined7 uVar2;
  long lVar3;
  Vector<tcu::Interval,_4> *pVVar4;
  IVal *pIVar5;
  Vector<tcu::Interval,_4> *pVVar6;
  long lVar7;
  byte bVar8;
  Vector<float,_4> local_a8;
  IVal local_90;
  
  bVar8 = 0;
  tcu::Matrix<tcu::Interval,_4,_2>::Matrix(__return_storage_ptr__);
  lVar7 = 0;
  pVVar4 = (Vector<tcu::Interval,_4> *)__return_storage_ptr__;
  do {
    pfVar1 = (float *)((long)(value->m_data).m_data[0].m_data + lVar7);
    local_a8.m_data._0_8_ = *(undefined8 *)pfVar1;
    local_a8.m_data._8_8_ = *(undefined8 *)(pfVar1 + 2);
    ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
              (&local_90,fmt,&local_a8);
    pIVar5 = &local_90;
    pVVar6 = pVVar4;
    for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
      uVar2 = *(undefined7 *)&pIVar5->m_data[0].field_0x1;
      (((IVal *)pVVar6)->m_data).m_data[0].m_data[0].m_hasNaN = pIVar5->m_data[0].m_hasNaN;
      *(undefined7 *)&(((IVal *)pVVar6)->m_data).m_data[0].m_data[0].field_0x1 = uVar2;
      pIVar5 = (IVal *)((long)pIVar5 + ((ulong)bVar8 * -2 + 1) * 8);
      pVVar6 = (Vector<tcu::Interval,_4> *)((long)pVVar6 + (ulong)bVar8 * -0x10 + 8);
    }
    lVar7 = lVar7 + 0x10;
    pVVar4 = pVVar4 + 1;
  } while (lVar7 == 0x10);
  return __return_storage_ptr__;
}

Assistant:

static IVal			doRound			(const FloatFormat& fmt, T value)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = round(fmt, value[ndx]);

		return ret;
	}